

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O3

size_t EntityRelationTask::predict_entity
                 (search *sch,example *ex,v_array<unsigned_long> *param_3,ptag my_tag,bool isLdf)

{
  long lVar1;
  void *pvVar2;
  byte *pbVar3;
  long *plVar4;
  action aVar5;
  predictor *ppVar6;
  long lVar7;
  byte *pbVar8;
  long lVar9;
  long lVar10;
  long *plVar11;
  float loss;
  v_array<unsigned_int> star_labels;
  v_array<unsigned_int> local_138;
  predictor local_118;
  
  pvVar2 = sch->task_data;
  if (*(char *)((long)pvVar2 + 0x11) == '\x01') {
    local_138.end_array = (uint *)0x0;
    local_138.erase_count = 0;
    local_138._begin = (uint *)0x0;
    local_138._end = (uint *)0x0;
    v_array<unsigned_int>::push_back(&local_138,(uint *)&(ex->l).empty);
    local_118.is_ldf = true;
    local_118._1_3_ = 0;
    v_array<unsigned_int>::push_back(&local_138,(uint *)&local_118);
    local_118.is_ldf = true;
    local_118._1_3_ = 0;
    v_array<unsigned_int>::push_back
              ((v_array<unsigned_int> *)((long)pvVar2 + 0x18),(uint *)&local_118);
    Search::predictor::predictor(&local_118,sch,my_tag);
    ppVar6 = Search::predictor::set_input(&local_118,ex);
    ppVar6 = Search::predictor::set_oracle(ppVar6,&local_138);
    ppVar6 = Search::predictor::set_allowed(ppVar6,(v_array<unsigned_int> *)((long)pvVar2 + 0x18));
    ppVar6 = Search::predictor::set_learner_id(ppVar6,1);
    aVar5 = Search::predictor::predict(ppVar6);
    Search::predictor::~predictor(&local_118);
    *(long *)((long)pvVar2 + 0x20) = *(long *)((long)pvVar2 + 0x20) + -4;
  }
  else {
    if (isLdf) {
      lVar7 = 0;
      do {
        lVar9 = lVar7 * 0x68d0;
        VW::copy_example_data(false,(example *)(*(long *)((long)pvVar2 + 0x60) + lVar9),ex);
        lVar10 = *(long *)((long)pvVar2 + 0x60);
        lVar1 = lVar7 + 1;
        pbVar8 = *(byte **)(lVar10 + lVar9);
        pbVar3 = *(byte **)(lVar10 + 8 + lVar9);
        if (pbVar8 != pbVar3) {
          do {
            plVar4 = *(long **)(lVar10 + lVar9 + 0x48 + (ulong)*pbVar8 * 0x68);
            for (plVar11 = *(long **)(lVar10 + lVar9 + 0x40 + (ulong)*pbVar8 * 0x68);
                plVar11 != plVar4; plVar11 = plVar11 + 1) {
              *plVar11 = *plVar11 * 0x1b90d09 + lVar1 * 0x49be95;
            }
            pbVar8 = pbVar8 + 1;
          } while (pbVar8 != pbVar3);
          lVar10 = *(long *)((long)pvVar2 + 0x60);
        }
        **(undefined4 **)(lVar10 + 0x6828 + lVar9) = 0;
        *(int *)(*(long *)(lVar10 + 0x6828 + lVar9) + 4) = (int)lVar7;
        *(undefined4 *)(*(long *)(lVar10 + 0x6828 + lVar9) + 8) = 0;
        *(undefined4 *)(*(long *)(lVar10 + 0x6828 + lVar9) + 0xc) = 0;
        lVar7 = lVar1;
      } while (lVar1 != 4);
      Search::predictor::predictor(&local_118,sch,my_tag);
      ppVar6 = Search::predictor::set_input(&local_118,*(example **)((long)pvVar2 + 0x60),4);
      ppVar6 = Search::predictor::set_oracle(ppVar6,(ex->l).multi.label - 1);
      ppVar6 = Search::predictor::set_learner_id(ppVar6,1);
      aVar5 = Search::predictor::predict(ppVar6);
      aVar5 = aVar5 + 1;
    }
    else {
      Search::predictor::predictor(&local_118,sch,my_tag);
      ppVar6 = Search::predictor::set_input(&local_118,ex);
      ppVar6 = Search::predictor::set_oracle(ppVar6,(ex->l).multi.label);
      ppVar6 = Search::predictor::set_allowed(ppVar6,(v_array<unsigned_int> *)((long)pvVar2 + 0x18))
      ;
      ppVar6 = Search::predictor::set_learner_id(ppVar6,0);
      aVar5 = Search::predictor::predict(ppVar6);
    }
    Search::predictor::~predictor(&local_118);
  }
  lVar7 = 0xc;
  if (aVar5 != 0xb) {
    lVar7 = 4;
    loss = 0.0;
    if (aVar5 == (ex->l).multi.label) goto LAB_0026e454;
  }
  loss = *(float *)((long)pvVar2 + lVar7);
LAB_0026e454:
  Search::search::loss(sch,loss);
  return (ulong)aVar5;
}

Assistant:

size_t predict_entity(
    Search::search& sch, example* ex, v_array<size_t>& /*predictions*/, ptag my_tag, bool isLdf = false)
{
  task_data* my_task_data = sch.get_task_data<task_data>();
  size_t prediction;
  if (my_task_data->allow_skip)
  {
    v_array<uint32_t> star_labels = v_init<uint32_t>();
    star_labels.push_back(ex->l.multi.label);
    star_labels.push_back(LABEL_SKIP);
    my_task_data->y_allowed_entity.push_back(LABEL_SKIP);
    prediction = Search::predictor(sch, my_tag)
                     .set_input(*ex)
                     .set_oracle(star_labels)
                     .set_allowed(my_task_data->y_allowed_entity)
                     .set_learner_id(1)
                     .predict();
    my_task_data->y_allowed_entity.pop();
  }
  else
  {
    if (isLdf)
    {
      for (uint32_t a = 0; a < 4; a++)
      {
        VW::copy_example_data(false, &my_task_data->ldf_entity[a], ex);
        update_example_indicies(true, &my_task_data->ldf_entity[a], 28904713, 4832917 * (uint64_t)(a + 1));
        CS::label& lab = my_task_data->ldf_entity[a].l.cs;
        lab.costs[0].x = 0.f;
        lab.costs[0].class_index = a;
        lab.costs[0].partial_prediction = 0.f;
        lab.costs[0].wap_value = 0.f;
      }
      prediction = Search::predictor(sch, my_tag)
                       .set_input(my_task_data->ldf_entity, 4)
                       .set_oracle(ex->l.multi.label - 1)
                       .set_learner_id(1)
                       .predict() +
          1;
    }
    else
    {
      prediction = Search::predictor(sch, my_tag)
                       .set_input(*ex)
                       .set_oracle(ex->l.multi.label)
                       .set_allowed(my_task_data->y_allowed_entity)
                       .set_learner_id(0)
                       .predict();
    }
  }

  // record loss
  float loss = 0.0;
  if (prediction == LABEL_SKIP)
  {
    loss = my_task_data->skip_cost;
  }
  else if (prediction != ex->l.multi.label)
    loss = my_task_data->entity_cost;
  sch.loss(loss);
  return prediction;
}